

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interactions.cc
# Opt level: O2

void INTERACTIONS::eval_count_of_generated_ft
               (vw *all,example *ec,size_t *new_features_cnt,float *new_features_value)

{
  byte bVar1;
  char cVar2;
  float *pfVar3;
  size_t i_1;
  char *pcVar4;
  int64_t iVar5;
  int64_t iVar6;
  long lVar7;
  char *pcVar8;
  features *pfVar9;
  ulong uVar10;
  ulong k;
  size_type sVar11;
  char *pcVar12;
  long lVar13;
  ulong uVar14;
  iterator __begin2;
  pointer pbVar15;
  long n;
  ulong n_00;
  float fVar16;
  float local_a4;
  float local_9c;
  size_t *local_98;
  float *local_90;
  pointer local_88;
  long local_80;
  v_array<float> results;
  
  *new_features_cnt = 0;
  *new_features_value = 0.0;
  results.end_array = (float *)0x0;
  results.erase_count = 0;
  results._begin = (float *)0x0;
  results._end = (float *)0x0;
  pbVar15 = (all->interactions).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_88 = (all->interactions).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_98 = new_features_cnt;
  local_90 = new_features_value;
  if (all->permutations == true) {
    for (; pbVar15 != local_88; pbVar15 = pbVar15 + 1) {
      fVar16 = 1.0;
      lVar13 = 1;
      for (sVar11 = 0; pbVar15->_M_string_length != sVar11; sVar11 = sVar11 + 1) {
        bVar1 = (pbVar15->_M_dataplus)._M_p[sVar11];
        lVar13 = lVar13 * ((long)(ec->super_example_predict).feature_space[bVar1].values._end -
                           (long)(ec->super_example_predict).feature_space[bVar1].values._begin >> 2
                          );
        if (lVar13 == 0) goto LAB_001f07d9;
        fVar16 = fVar16 * (ec->super_example_predict).feature_space[bVar1].sum_feat_sq;
      }
      *new_features_cnt = *new_features_cnt + lVar13;
      *new_features_value = fVar16 + *new_features_value;
LAB_001f07d9:
    }
  }
  else {
    for (; lVar13 = 1, pbVar15 != local_88; pbVar15 = pbVar15 + 1) {
      pcVar12 = (pbVar15->_M_dataplus)._M_p;
      local_a4 = 1.0;
      pcVar4 = pcVar12;
      for (; pcVar8 = pcVar4 + pbVar15->_M_string_length, pcVar12 != pcVar8; pcVar12 = pcVar12 + 1)
      {
        cVar2 = *pcVar12;
        if ((pcVar12 == pcVar8 + -1) || (cVar2 != pcVar12[1])) {
          lVar13 = ((long)(ec->super_example_predict).feature_space[cVar2].values._end -
                    (long)(ec->super_example_predict).feature_space[cVar2].values._begin >> 2) *
                   lVar13;
          if (lVar13 == 0) goto LAB_001f0a36;
          fVar16 = (ec->super_example_predict).feature_space[cVar2].sum_feat_sq;
        }
        else {
          k = 2;
          for (pcVar4 = pcVar12 + 2; pcVar4 < pcVar8; pcVar4 = pcVar4 + 1) {
            k = k + (cVar2 == *pcVar4);
          }
          for (uVar10 = 0; uVar10 < (ulong)((long)results._end - (long)results._begin >> 2);
              uVar10 = uVar10 + 1) {
            results._begin[uVar10] = 0.0;
          }
          while ((ulong)((long)results._end - (long)results._begin >> 2) < k) {
            local_9c = 0.0;
            v_array<float>::push_back(&results,&local_9c);
          }
          pfVar9 = (ec->super_example_predict).feature_space + cVar2;
          n = -1;
          uVar10 = 0;
          while( true ) {
            pfVar3 = (pfVar9->values)._begin;
            uVar14 = (long)(pfVar9->values)._end - (long)pfVar3 >> 2;
            n_00 = uVar14 - uVar10;
            if (uVar14 < uVar10 || n_00 == 0) break;
            fVar16 = pfVar3[uVar10];
            fVar16 = fVar16 * fVar16;
            *results._begin = *results._begin + fVar16;
            for (uVar14 = 1; uVar14 < k; uVar14 = uVar14 + 1) {
              results._begin[uVar14] = results._begin[uVar14 - 1] * fVar16 + results._begin[uVar14];
            }
            uVar10 = uVar10 + 1;
            n = n + 1;
          }
          fVar16 = results._begin[k - 1];
          if ((uVar10 == 0) && (uVar14 < k)) goto LAB_001f0a36;
          if (uVar10 == 0) {
            iVar6 = choose(uVar14,k);
          }
          else {
            local_80 = 0;
            uVar10 = k;
            for (uVar14 = 0; iVar5 = 1, iVar6 = local_80, uVar14 <= k; uVar14 = uVar14 + 1) {
              if (uVar14 != 0) {
                iVar5 = choose(n,uVar14);
              }
              if (n_00 < uVar10) {
                lVar7 = 0;
              }
              else {
                iVar6 = choose(n_00,uVar10);
                lVar7 = iVar6 * iVar5;
              }
              local_80 = local_80 + lVar7;
              n = n + 1;
              uVar10 = uVar10 - 1;
            }
          }
          lVar13 = iVar6 * lVar13;
          pcVar12 = pcVar12 + (k - 1);
          pcVar4 = (pbVar15->_M_dataplus)._M_p;
        }
        local_a4 = local_a4 * fVar16;
      }
      if (lVar13 != 0) {
        *local_98 = *local_98 + lVar13;
        *local_90 = local_a4 + *local_90;
      }
LAB_001f0a36:
    }
  }
  v_array<float>::delete_v(&results);
  return;
}

Assistant:

void eval_count_of_generated_ft(vw& all, example& ec, size_t& new_features_cnt, float& new_features_value)
{
  new_features_cnt = 0;
  new_features_value = 0.;

  v_array<float> results = v_init<float>();

  if (all.permutations)
  {
    // just multiply precomputed values for all namespaces
    for (std::string& inter : all.interactions)
    {
      size_t num_features_in_inter = 1;
      float sum_feat_sq_in_inter = 1.;

      for (namespace_index ns : inter)
      {
        num_features_in_inter *= ec.feature_space[ns].size();
        sum_feat_sq_in_inter *= ec.feature_space[ns].sum_feat_sq;
        if (num_features_in_inter == 0)
          break;
      }

      if (num_features_in_inter == 0)
        continue;

      new_features_cnt += num_features_in_inter;
      new_features_value += sum_feat_sq_in_inter;
    }
  }
  else  // case of simple combinations
  {
#ifdef DEBUG_EVAL_COUNT_OF_GEN_FT
    size_t correct_features_cnt = 0;
    float correct_features_value = 0.;
    eval_gen_data dat(correct_features_cnt, correct_features_value);
    generate_interactions<eval_gen_data, uint64_t, ft_cnt>(all, ec, dat);
#endif

    for (std::string& inter : all.interactions)
    {
      size_t num_features_in_inter = 1;
      float sum_feat_sq_in_inter = 1.;

      for (auto ns = inter.begin(); ns != inter.end(); ++ns)
      {
        if ((ns == inter.end() - 1) || (*ns != *(ns + 1)))  // neighbour namespaces are different
        {
          // just multiply precomputed values
          const int nsc = *ns;
          num_features_in_inter *= ec.feature_space[nsc].size();
          sum_feat_sq_in_inter *= ec.feature_space[nsc].sum_feat_sq;
          if (num_features_in_inter == 0)
            break;  // one of namespaces has no features - go to next interaction
        }
        else  // we are at beginning of a block made of same namespace (interaction is preliminary sorted)
        {
          // let's find out real length of this block
          size_t order_of_inter = 2;  // alredy compared ns == ns+1

          for (auto ns_end = ns + 2; ns_end < inter.end(); ++ns_end)
            if (*ns == *ns_end)
              ++order_of_inter;

          // namespace is same for whole block
          features& fs = ec.feature_space[(const int)*ns];

          // count number of features with value != 1.;
          size_t cnt_ft_value_non_1 = 0;

          // in this block we shall calculate number of generated features and sum of their values
          // keeping in mind rules applicable for simple combinations instead of permutations

          // let's calculate sum of their squared value for whole block

          // ensure results as big as order_of_inter and empty.
          for (size_t i = 0; i < results.size(); ++i) results[i] = 0.;
          while (results.size() < order_of_inter) results.push_back(0.);

          // recurrent value calculations
          for (size_t i = 0; i < fs.size(); ++i)
          {
            const float x = fs.values[i] * fs.values[i];

            if (!PROCESS_SELF_INTERACTIONS(fs.values[i]))
            {
              for (size_t i = order_of_inter - 1; i > 0; --i) results[i] += results[i - 1] * x;

              results[0] += x;
            }
            else
            {
              results[0] += x;

              for (size_t i = 1; i < order_of_inter; ++i) results[i] += results[i - 1] * x;

              ++cnt_ft_value_non_1;
            }
          }

          sum_feat_sq_in_inter *= results[order_of_inter - 1];  // will be explained in http://bit.ly/1Hk9JX1

          // let's calculate  the number of a new features

          // if number of features is less than  order of interaction then go to the next interaction
          // as you can't make simple combination of interaction 'aaa' if a contains < 3 features.
          // unless one of them has value != 1. and we are counting them.
          const size_t ft_size = fs.size();
          if (cnt_ft_value_non_1 == 0 && ft_size < order_of_inter)
          {
            num_features_in_inter = 0;
            break;
          }

          size_t n;
          if (cnt_ft_value_non_1 == 0)  // number of generated simple combinations is C(n,k)
          {
            n = (size_t)choose((int64_t)ft_size, (int64_t)order_of_inter);
          }
          else
          {
            n = 0;
            for (size_t l = 0; l <= order_of_inter; ++l)
            {
              // C(l+m-1, l) * C(n-m, k-l)
              size_t num = (l == 0) ? 1 : (size_t)choose(l + cnt_ft_value_non_1 - 1, l);

              if (ft_size - cnt_ft_value_non_1 >= order_of_inter - l)
                num *= (size_t)choose(ft_size - cnt_ft_value_non_1, order_of_inter - l);
              else
                num = 0;

              n += num;
            }

          }  // details on http://bit.ly/1Hk9JX1

          num_features_in_inter *= n;

          ns += order_of_inter - 1;  // jump over whole block
        }
      }

      if (num_features_in_inter == 0)
        continue;  // signal that values should be ignored (as default value is 1)

      new_features_cnt += num_features_in_inter;
      new_features_value += sum_feat_sq_in_inter;
    }

#ifdef DEBUG_EVAL_COUNT_OF_GEN_FT
    if (correct_features_cnt != new_features_cnt)
      all.trace_message << "Incorrect new features count " << new_features_cnt << " must be " << correct_features_cnt
                        << endl;
    if (fabs(correct_features_value - new_features_value) > 1e-5)
      all.trace_message << "Incorrect new features value " << new_features_value << " must be "
                        << correct_features_value << endl;
#endif
  }

  results.delete_v();
}